

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm_info.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_4821::Options::Options(Options *this)

{
  Options *this_local;
  
  this->output_video = true;
  this->output_audio = true;
  this->output_size = false;
  this->output_offset = false;
  this->output_seconds = true;
  this->output_ebml_header = true;
  this->output_segment = true;
  this->output_seekhead = false;
  this->output_segment_info = true;
  this->output_tracks = true;
  this->output_clusters = false;
  this->output_blocks = false;
  this->output_codec_info = false;
  this->output_clusters_size = false;
  this->output_encrypted_info = false;
  this->output_cues = false;
  this->output_frame_stats = false;
  this->output_vp9_level = false;
  return;
}

Assistant:

Options::Options()
    : output_video(true),
      output_audio(true),
      output_size(false),
      output_offset(false),
      output_seconds(true),
      output_ebml_header(true),
      output_segment(true),
      output_seekhead(false),
      output_segment_info(true),
      output_tracks(true),
      output_clusters(false),
      output_blocks(false),
      output_codec_info(false),
      output_clusters_size(false),
      output_encrypted_info(false),
      output_cues(false),
      output_frame_stats(false),
      output_vp9_level(false) {}